

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
          (ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
           *this,BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                 e)

{
  Precedence PVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  char *__s;
  size_t __n;
  Precedence precedence;
  ptrdiff_t _Num;
  ulong uVar5;
  char *str;
  
  PVar1 = expr::PrecInfo::INFO
          [*(uint *)e.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_];
  precedence = UNARY;
  if (PVar1 != EXPONENTIATION) {
    precedence = PVar1;
  }
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)this,(NumericExpr)
                ((ExprBase *)
                ((long)e.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.
                       impl_ + 8))->impl_,precedence);
  lVar2 = *(long *)(this + 8);
  puVar3 = *(undefined8 **)(lVar2 + 8);
  if (puVar3[2] == puVar3[3]) {
    (**(code **)*puVar3)(puVar3,puVar3[2] + 1);
  }
  lVar4 = puVar3[2];
  puVar3[2] = lVar4 + 1;
  *(undefined1 *)(puVar3[1] + lVar4) = 0x20;
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_].
        str;
  __n = strlen(__s);
  puVar3 = *(undefined8 **)(lVar2 + 8);
  uVar5 = puVar3[2] + __n;
  if ((ulong)puVar3[3] < uVar5) {
    (**(code **)*puVar3)(puVar3,uVar5);
  }
  if (__n != 0) {
    memmove((void *)(puVar3[1] + puVar3[2]),__s,__n);
  }
  puVar3[2] = uVar5;
  puVar3 = *(undefined8 **)(lVar2 + 8);
  if (puVar3[2] == puVar3[3]) {
    (**(code **)*puVar3)(puVar3,puVar3[2] + 1);
  }
  lVar2 = puVar3[2];
  puVar3[2] = lVar2 + 1;
  *(undefined1 *)(puVar3[1] + lVar2) = 0x20;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)this,(NumericExpr)
                ((ExprBase *)
                ((long)e.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.
                       impl_ + 0x10))->impl_,(PVar1 != EXPONENTIATION) + PVar1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteBinary(ExprType e) {
  int prec = precedence(e);
  bool right_associative = prec == prec::EXPONENTIATION;
  Visit(e.lhs(), prec + (right_associative ? 1 : 0));
  writer_ << ' ' << str(e.kind()) << ' ';
  Visit(e.rhs(), prec + (right_associative ? 0 : 1));
}